

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

bool __thiscall MathInterpreter::isVariable(MathInterpreter *this,string *s)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  if ((cVar1 < '{') && ('`' < cVar1 || (byte)(cVar1 + 0xbfU) < 0x1a)) {
    uVar3 = s->_M_string_length;
    uVar5 = 1;
    if (1 < uVar3) {
      uVar6 = 2;
      do {
        cVar1 = pcVar2[uVar5];
        if ('z' < cVar1) break;
        if (cVar1 < 'a') {
          if (cVar1 < '[') {
            if (9 < (byte)(cVar1 - 0x30U) && cVar1 < 'A') break;
          }
          else if (cVar1 != '_') break;
        }
        bVar4 = uVar6 < uVar3;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar4);
    }
    if (uVar3 == uVar5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool MathInterpreter::isVariable(string s) {
  unsigned int i = 0;
  std::size_t size = s.size();
  if (((s[i] <= 'z') && (s[i] >= 'a')) || ((s[i] <= 'Z') && (s[i] >= 'A'))) {
    i++;
    while (i < size && (((s[i] <= 'z') && (s[i] >= 'a'))
        || ((s[i] <= 'Z') && (s[i] >= 'A')) || (s[i] == '_')
        || ((s[i] <= '9') && (s[i] >= '0')))) {
      i++;
    }
    if (i == size) {
      return true;
    }
  }
  return false;
}